

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O2

bool __thiscall
cmVariableWatch::VariableAccessed
          (cmVariableWatch *this,string *variable,int access_type,char *newValue,cmMakefile *mf)

{
  const_iterator cVar1;
  _Rb_tree_header *p_Var2;
  pointer pwVar3;
  shared_ptr<cmVariableWatch::Pair> it;
  vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
  vp;
  __shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2> local_58;
  vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
  local_48;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>_>
                  *)this,variable);
  p_Var2 = &(this->WatchMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node != p_Var2) {
    std::
    vector<std::weak_ptr<cmVariableWatch::Pair>,std::allocator<std::weak_ptr<cmVariableWatch::Pair>>>
    ::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<cmVariableWatch::Pair>const*,std::vector<std::shared_ptr<cmVariableWatch::Pair>,std::allocator<std::shared_ptr<cmVariableWatch::Pair>>>>,void>
              ((vector<std::weak_ptr<cmVariableWatch::Pair>,std::allocator<std::weak_ptr<cmVariableWatch::Pair>>>
                *)&local_48,*(shared_ptr<cmVariableWatch::Pair> **)(cVar1._M_node + 2),
               (shared_ptr<cmVariableWatch::Pair> *)cVar1._M_node[2]._M_parent,
               (allocator_type *)&local_58);
    for (pwVar3 = local_48.
                  super__Vector_base<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pwVar3 != local_48.
                  super__Vector_base<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pwVar3 = pwVar3 + 1) {
      std::__shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_58,pwVar3);
      if (local_58._M_ptr != (element_type *)0x0) {
        (*(local_58._M_ptr)->Method)(variable,access_type,(local_58._M_ptr)->ClientData,newValue,mf)
        ;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    }
    std::
    vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
    ::~vector(&local_48);
  }
  return (_Rb_tree_header *)cVar1._M_node != p_Var2;
}

Assistant:

bool cmVariableWatch::VariableAccessed(const std::string& variable,
                                       int access_type, const char* newValue,
                                       const cmMakefile* mf) const
{
  auto mit = this->WatchMap.find(variable);
  if (mit != this->WatchMap.end()) {
    // The strategy here is to copy the list of callbacks, and ignore
    // new callbacks that existing ones may add.
    std::vector<std::weak_ptr<Pair>> vp(mit->second.begin(),
                                        mit->second.end());
    for (auto& weak_it : vp) {
      // In the case where a callback was removed, the weak_ptr will not be
      // lockable, and so this ensures we don't attempt to call into freed
      // memory
      if (auto it = weak_it.lock()) {
        it->Method(variable, access_type, it->ClientData, newValue, mf);
      }
    }
    return true;
  }
  return false;
}